

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

void __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>::~Simplex_tree
          (Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *this)

{
  Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *this_local;
  
  root_members_recursive_deletion(this);
  std::
  vector<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_std::allocator<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_>_>
  ::~vector(&this->filtration_vect_);
  Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>,_std::less<int>,_void,_void>_>
  ::~Simplex_tree_siblings(&this->root_);
  std::
  unordered_map<int,_boost::intrusive::list<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::member_hook<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_boost::intrusive::constant_time_size<false>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_boost::intrusive::list<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::member_hook<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_boost::intrusive::constant_time_size<false>_>_>_>_>
  ::~unordered_map(&this->nodes_label_to_list_);
  return;
}

Assistant:

~Simplex_tree() {
    root_members_recursive_deletion();
  }